

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<boost::basic_wrap_stringstream<char>>::reset<boost::basic_wrap_stringstream<char>>
          (shared_ptr<boost::basic_wrap_stringstream<char>> *this,basic_wrap_stringstream<char> *p)

{
  undefined8 uVar1;
  sp_counted_base *psVar2;
  undefined8 local_18;
  shared_count sStack_10;
  
  if ((p != (basic_wrap_stringstream<char> *)0x0) && (*(basic_wrap_stringstream<char> **)this == p))
  {
    __assert_fail("p == 0 || p != px",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                  ,0x2ba,
                  "void boost::shared_ptr<boost::basic_wrap_stringstream<char>>::reset(Y *) [T = boost::basic_wrap_stringstream<char>, Y = boost::basic_wrap_stringstream<char>]"
                 );
  }
  shared_ptr<boost::basic_wrap_stringstream<char>>
            ((shared_ptr<boost::basic_wrap_stringstream<char>> *)&local_18,p);
  uVar1 = *(undefined8 *)this;
  psVar2 = *(sp_counted_base **)(this + 8);
  *(undefined8 *)this = local_18;
  *(sp_counted_base **)(this + 8) = sStack_10.pi_;
  local_18 = uVar1;
  sStack_10.pi_ = psVar2;
  detail::shared_count::~shared_count(&sStack_10);
  return;
}

Assistant:

void reset( Y * p ) // Y must be complete
    {
        BOOST_ASSERT( p == 0 || p != px ); // catch self-reset errors
        this_type( p ).swap( *this );
    }